

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ze_nullddi.cpp
# Opt level: O0

ze_result_t
driver::zeRTASParallelOperationGetPropertiesExt
          (ze_rtas_parallel_operation_ext_handle_t hParallelOperation,
          ze_rtas_parallel_operation_ext_properties_t *pProperties)

{
  ze_pfnRTASParallelOperationGetPropertiesExt_t pfnGetPropertiesExt;
  ze_result_t result;
  ze_rtas_parallel_operation_ext_properties_t *pProperties_local;
  ze_rtas_parallel_operation_ext_handle_t hParallelOperation_local;
  
  pfnGetPropertiesExt._4_4_ = ZE_RESULT_SUCCESS;
  if (DAT_0011c188 != (code *)0x0) {
    pfnGetPropertiesExt._4_4_ = (*DAT_0011c188)(hParallelOperation,pProperties);
  }
  return pfnGetPropertiesExt._4_4_;
}

Assistant:

__zedlllocal ze_result_t ZE_APICALL
    zeRTASParallelOperationGetPropertiesExt(
        ze_rtas_parallel_operation_ext_handle_t hParallelOperation, ///< [in] handle of parallel operation object
        ze_rtas_parallel_operation_ext_properties_t* pProperties///< [in,out] query result for parallel operation properties
        )
    {
        ze_result_t result = ZE_RESULT_SUCCESS;

        // if the driver has created a custom function, then call it instead of using the generic path
        auto pfnGetPropertiesExt = context.zeDdiTable.RTASParallelOperation.pfnGetPropertiesExt;
        if( nullptr != pfnGetPropertiesExt )
        {
            result = pfnGetPropertiesExt( hParallelOperation, pProperties );
        }
        else
        {
            // generic implementation
        }

        return result;
    }